

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

DropoutParameter * __thiscall caffe::DropoutParameter::New(DropoutParameter *this,Arena *arena)

{
  DropoutParameter *this_00;
  
  this_00 = (DropoutParameter *)operator_new(0x20);
  DropoutParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::DropoutParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

DropoutParameter* DropoutParameter::New(::google::protobuf::Arena* arena) const {
  DropoutParameter* n = new DropoutParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}